

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

void kname(Proto *p,int pc,int c,char **name)

{
  GCObject *pGVar1;
  char *pcVar2;
  
  if ((char)c < '\0') {
    if ((p->k[c & 0xffffff7fU].tt_ & 0xf) == 4) {
      pGVar1 = p->k[c & 0xffffff7fU].value_.gc;
      if ((pGVar1->tt & 0xf) == 4) {
        *name = (char *)&pGVar1[1].tt;
        return;
      }
      __assert_fail("(((((kvalue)->value_).gc)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldebug.c"
                    ,0x17f,"void kname(Proto *, int, int, const char **)");
    }
  }
  else {
    pcVar2 = getobjname(p,pc,c,name);
    if ((pcVar2 != (char *)0x0) && (*pcVar2 == 'c')) {
      return;
    }
  }
  *name = "?";
  return;
}

Assistant:

static void kname (Proto *p, int pc, int c, const char **name) {
  if (ISK(c)) {  /* is 'c' a constant? */
    TValue *kvalue = &p->k[INDEXK(c)];
    if (ttisstring(kvalue)) {  /* literal constant? */
      *name = svalue(kvalue);  /* it is its own name */
      return;
    }
    /* else no reasonable name found */
  }
  else {  /* 'c' is a register */
    const char *what = getobjname(p, pc, c, name); /* search for 'c' */
    if (what && *what == 'c') {  /* found a constant name? */
      return;  /* 'name' already filled */
    }
    /* else no reasonable name found */
  }
  *name = "?";  /* no reasonable name found */
}